

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBitVector.cpp
# Opt level: O0

void __thiscall BVFixed::ComplimentAll(BVFixed *this)

{
  BVIndex BVar1;
  uint local_14;
  BVIndex i;
  BVFixed *this_local;
  
  local_14 = 0;
  while( true ) {
    BVar1 = WordCount(this);
    if (BVar1 <= local_14) break;
    BVUnitT<unsigned_long>::ComplimentAll((BVUnitT<unsigned_long> *)(this + (ulong)local_14 + 1));
    local_14 = local_14 + 1;
  }
  ClearEnd(this);
  return;
}

Assistant:

void
BVFixed::ComplimentAll()
{
    for(BVIndex i=0; i < this->WordCount(); i++)
    {
        this->data[i].ComplimentAll();
    }

    ClearEnd();
}